

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O2

Gia_Man_t * Gia_ManFalseRebuild(Gia_Man_t *p,Vec_Wec_t *vHooks,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pObj;
  Vec_Int_t *vHook;
  Gia_Man_t *pGVar5;
  ulong uVar6;
  int v;
  
  p_00 = Gia_ManStart((p->nObjs << 2) / 3);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  for (v = 1; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar3 = (uint)*(ulong *)pObj;
    uVar6 = *(ulong *)pObj & 0x1fffffff;
    iVar2 = (int)uVar6;
    if (uVar6 == 0x1fffffff || (int)uVar3 < 0) {
      if ((~uVar3 & 0x9fffffff) == 0) {
        uVar3 = Gia_ManAppendCi(p_00);
      }
      else {
        if (-1 < (int)uVar3 || iVar2 == 0x1fffffff) goto LAB_005d32bc;
        iVar2 = Gia_ObjFanin0Copy(pObj);
        uVar3 = Gia_ManAppendCo(p_00,iVar2);
      }
LAB_005d32b9:
      pObj->Value = uVar3;
    }
    else {
      iVar1 = Vec_WecLevelSize(vHooks,v);
      if (iVar1 < 1) {
        iVar2 = Gia_ObjFanin0Copy(pObj);
        iVar1 = Gia_ObjFanin1Copy(pObj);
        uVar3 = Gia_ManHashAnd(p_00,iVar2,iVar1);
        goto LAB_005d32b9;
      }
      if (fVeryVerbose != 0) {
        printf("Path %d : ");
      }
      vHook = Vec_WecEntry(vHooks,v);
      Gia_ManFalseRebuildOne(p_00,p,vHook,iVar2,fVeryVerbose);
    }
LAB_005d32bc:
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManFalseRebuild( Gia_Man_t * p, Vec_Wec_t * vHooks, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    pNew = Gia_ManStart( 4 * Gia_ManObjNum(p) / 3 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Vec_WecLevelSize(vHooks, i) > 0 )
            {
                if ( fVeryVerbose )
                    printf( "Path %d : ", Counter++ );
                Gia_ManFalseRebuildOne( pNew, p, Vec_WecEntry(vHooks, i), fVerbose, fVeryVerbose );
            }
            else
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}